

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdkanji.c
# Opt level: O1

int any2eucjp(uchar *dest,uchar *src,uint dest_max)

{
  long lVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *__s1;
  int iVar5;
  int iVar6;
  byte bVar7;
  byte *pbVar8;
  long lVar9;
  uchar *tmp_p;
  
  sVar4 = strlen((char *)src);
  iVar3 = DetectKanjiCode_whatcode;
  if (sVar4 < 0x2000) {
    if (dest_max < 0x2001) {
      iVar2 = 8;
      if (DetectKanjiCode_whatcode - 9U < 0xfffffffe) {
        DetectKanjiCode_whatcode = 8;
        iVar2 = iVar3;
      }
      iVar3 = DetectKanjiCode_whatcode;
      if (DetectKanjiCode_whatcode - 7U < 2) {
        iVar5 = 0;
        do {
          lVar9 = (long)iVar5;
          lVar1 = lVar9 + 1;
          bVar7 = src[lVar9];
          if (bVar7 == 0) {
LAB_001228fa:
            iVar6 = (int)lVar1;
          }
          else {
            if (bVar7 != 0x1b) {
              if (0xc < (byte)(bVar7 + 0x7f) && 0x10 < (byte)(bVar7 + 0x71)) {
                if (bVar7 == 0x8e) {
                  bVar7 = src[lVar1];
                  if ((((byte)(bVar7 + 0x20) < 0x1d) || ((char)bVar7 < -0x5f)) ||
                     ((byte)(bVar7 - 0x40) < 0x3f)) {
LAB_00122b13:
                    DetectKanjiCode_whatcode = 6;
                    iVar3 = 6;
                    iVar6 = iVar5 + 2;
                  }
                  else {
                    iVar6 = iVar5 + 2;
                    if ((byte)(bVar7 + 0x5f) < 0x3f) {
LAB_00122a0f:
                      DetectKanjiCode_whatcode = 7;
                      iVar3 = 7;
                      iVar6 = iVar5 + 2;
                    }
                  }
                }
                else {
                  if (0x3e < (byte)(bVar7 + 0x5f)) {
                    if ((byte)(bVar7 + 0x10) < 0xf) {
                      DetectKanjiCode_whatcode = 5;
                      iVar3 = 5;
                    }
                    else if ((bVar7 & 0xf0) == 0xe0) {
                      bVar7 = src[lVar1];
                      if ((char)bVar7 < -0x5f || (byte)(bVar7 - 0x40) < 0x3f) goto LAB_00122b13;
                      if (1 < (byte)(bVar7 + 3)) {
                        iVar6 = iVar5 + 2;
                        if (0x5b < (byte)(bVar7 + 0x5f)) goto LAB_00122b22;
                        goto LAB_00122a0f;
                      }
                      goto LAB_001229b2;
                    }
                    goto LAB_001228fa;
                  }
                  iVar6 = iVar5 + 2;
                  bVar7 = src[lVar1];
                  if ((byte)(bVar7 + 0x10) < 0xf) {
LAB_001229b2:
                    DetectKanjiCode_whatcode = 5;
                    iVar3 = 5;
                    iVar6 = iVar5 + 2;
                  }
                  else {
                    if ((byte)(bVar7 + 0x5f) < 0x3f) goto LAB_00122a0f;
                    if ((bVar7 & 0xf0) == 0xe0) {
                      DetectKanjiCode_whatcode = 7;
                      iVar3 = 7;
                      if (0x3f < bVar7) {
                        pbVar8 = src + iVar6;
                        iVar3 = 7;
                        do {
                          if (0x80 < bVar7) {
                            iVar5 = 6;
                            if (((bVar7 < 0x8e) || (bVar7 != 0x8e && bVar7 < 0xa0)) ||
                               (iVar5 = 5, bVar7 != 0xff && 0xfc < bVar7)) {
                              iVar3 = iVar5;
                              DetectKanjiCode_whatcode = iVar3;
                            }
                          }
                          bVar7 = *pbVar8;
                          iVar6 = iVar6 + 1;
                        } while ((0x3f < bVar7) && (pbVar8 = pbVar8 + 1, iVar3 == 7));
                      }
                    }
                    else if (bVar7 < 0xa0) goto LAB_00122b13;
                  }
                }
                goto LAB_00122b22;
              }
              DetectKanjiCode_whatcode = 6;
              iVar3 = 6;
              goto LAB_001228fa;
            }
            lVar9 = lVar9 + 2;
            bVar7 = src[lVar1];
            if (bVar7 == 0x4b) {
              DetectKanjiCode_whatcode = 4;
              bVar7 = 0x42;
              iVar3 = 4;
LAB_0012298f:
              iVar6 = (int)lVar9;
            }
            else if (bVar7 == 0x28) {
              bVar7 = src[lVar9];
              iVar6 = iVar5 + 3;
              if (bVar7 == 0x49) {
                DetectKanjiCode_whatcode = 3;
                bVar7 = 0x42;
                iVar3 = 3;
              }
            }
            else {
              if (bVar7 != 0x24) goto LAB_0012298f;
              iVar6 = iVar5 + 3;
              bVar7 = src[lVar9];
              if (bVar7 == 0x42) {
                DetectKanjiCode_whatcode = 1;
                bVar7 = 0x42;
                iVar3 = 1;
              }
              else if (bVar7 == 0x40) {
                DetectKanjiCode_whatcode = 2;
                bVar7 = 0x42;
                iVar3 = 2;
              }
            }
          }
LAB_00122b22:
          iVar5 = iVar6;
        } while ((bVar7 != 0) && (iVar3 - 7U < 2));
      }
      if (iVar2 != 8 && iVar3 == 7) {
        DetectKanjiCode_whatcode = iVar2;
      }
      iVar3 = DetectKanjiCode_whatcode;
      if (DetectKanjiCode_whatcode == 7) {
        __s1 = getenv("LC_ALL");
        if ((__s1 == (char *)0x0) && (__s1 = getenv("LC_CTYPE"), __s1 == (char *)0x0)) {
          __s1 = getenv("LANG");
        }
        iVar3 = DetectKanjiCode_whatcode;
        if (__s1 != (char *)0x0) {
          iVar2 = strcmp(__s1,"ja_JP.SJIS");
          iVar3 = 6;
          if ((((iVar2 != 0) && (iVar2 = strcmp(__s1,"ja_JP.mscode"), iVar2 != 0)) &&
              (iVar2 = strcmp(__s1,"ja_JP.PCK"), iVar2 != 0)) &&
             (iVar2 = strncmp(__s1,"ja",2), iVar3 = DetectKanjiCode_whatcode, iVar2 == 0)) {
            iVar3 = 5;
          }
        }
      }
      DetectKanjiCode_whatcode = iVar3;
      if (DetectKanjiCode_whatcode == 7) {
        DetectKanjiCode_whatcode = 5;
      }
      iVar3 = (*(code *)((long)&DAT_00126540 +
                        (long)(int)(&DAT_00126540)[DetectKanjiCode_whatcode - 1]))();
      return iVar3;
    }
    gd_error("invalid maximum size of destination\nit should be less than %d.",0x2000);
  }
  else {
    gd_error("input string too large");
  }
  return -1;
}

Assistant:

int
any2eucjp (unsigned char *dest, unsigned char *src, unsigned int dest_max)
{
	static unsigned char tmp_dest[BUFSIZ];
	int ret;

	if (strlen ((const char *) src) >= BUFSIZ) {
		gd_error("input string too large");
		return -1;
	}
	if (dest_max > BUFSIZ) {
		gd_error
		("invalid maximum size of destination\nit should be less than %d.",
		 BUFSIZ);
		return -1;
	}
	ret = do_check_and_conv (tmp_dest, src);
	if (strlen ((const char *) tmp_dest) >= dest_max) {
		gd_error("output buffer overflow");
		ustrcpy (dest, src);
		return -1;
	}
	ustrcpy (dest, tmp_dest);
	return ret;
}